

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

size_t __thiscall llvm::StringRef::count(StringRef *this,StringRef Str)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  StringRef RHS;
  StringRef local_48;
  char *local_38;
  
  RHS.Length = Str.Length;
  local_38 = Str.Data;
  uVar1 = this->Length;
  if (uVar1 < RHS.Length) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    for (uVar6 = 0; (uVar1 - RHS.Length) + 1 != uVar6; uVar6 = uVar6 + 1) {
      uVar2 = this->Length;
      uVar4 = uVar6;
      if (uVar2 < uVar6) {
        uVar4 = uVar2;
      }
      local_48.Data = this->Data + uVar4;
      local_48.Length = uVar2 - uVar4;
      if (RHS.Length <= uVar2 - uVar4) {
        local_48.Length = RHS.Length;
      }
      RHS.Data = local_38;
      bVar3 = equals(&local_48,RHS);
      sVar5 = sVar5 + bVar3;
    }
  }
  return sVar5;
}

Assistant:

size_t StringRef::count(StringRef Str) const {
  size_t Count = 0;
  size_t N = Str.size();
  if (N > Length)
    return 0;
  for (size_t i = 0, e = Length - N + 1; i != e; ++i)
    if (substr(i, N).equals(Str))
      ++Count;
  return Count;
}